

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  short sVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiTabItem *pIVar7;
  ImDrawList *draw_list;
  uint3 uVar8;
  ImGuiIO *pIVar9;
  ImGuiContext *pIVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  ImU32 id;
  ImU32 IVar15;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar16;
  size_t sVar17;
  char *pcVar18;
  int iVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  int iVar22;
  int iVar23;
  ImGuiContext *pIVar24;
  ImGuiCol idx;
  ulong uVar25;
  ulong uVar26;
  bool *pbVar27;
  bool bVar28;
  uint uVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  bool text_clipped;
  bool just_closed;
  ImRect bb;
  bool local_b8;
  bool held;
  float local_94;
  ImGuiWindow *local_90;
  bool hovered;
  float fStack_84;
  undefined4 local_7c;
  uint local_78;
  int local_74;
  ImGuiContext *local_70;
  char *local_68;
  uint local_60;
  uint local_5c;
  float local_58;
  float fStack_54;
  ImVec2 local_40;
  bool *local_38;
  
  pIVar10 = GImGui;
  if (tab_bar->WantLayout == true) {
    uVar3 = *(undefined4 *)&(GImGui->NextItemData).OpenVal;
    bb.Min.x = (float)(GImGui->NextItemData).Flags;
    bb.Min.y = (GImGui->NextItemData).Width;
    bb.Max.x = (float)(GImGui->NextItemData).FocusScopeId;
    bb.Max.y = (float)(GImGui->NextItemData).OpenCond;
    TabBarLayout(tab_bar);
    local_b8 = SUB41(uVar3,0);
    (pIVar10->NextItemData).OpenVal = local_b8;
    (pIVar10->NextItemData).Flags = (ImGuiNextItemDataFlags)bb.Min.x;
    (pIVar10->NextItemData).Width = bb.Min.y;
    (pIVar10->NextItemData).FocusScopeId = (ImGuiID)bb.Max.x;
    (pIVar10->NextItemData).OpenCond = (ImGuiCond)bb.Max.y;
  }
  pIVar6 = pIVar10->CurrentWindow;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return false;
  }
  pbVar27 = (bool *)0x0;
  uVar29 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar27 = p_open;
    uVar29 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar29 = flags;
  }
  if (id == 0) {
LAB_002241e6:
    pIVar21 = (ImGuiContext *)0x0;
  }
  else {
    uVar26 = (ulong)(tab_bar->Tabs).Size;
    bVar28 = 0 < (long)uVar26;
    pIVar21 = pIVar10;
    if (0 < (long)uVar26) {
      pIVar21 = (ImGuiContext *)(tab_bar->Tabs).Data;
      bVar28 = true;
      IVar15._0_1_ = pIVar21->Initialized;
      IVar15._1_1_ = pIVar21->FontAtlasOwnedByContext;
      IVar15._2_2_ = *(undefined2 *)&pIVar21->field_0x2;
      if (IVar15 != id) {
        pIVar20 = pIVar21;
        uVar12 = 1;
        do {
          uVar25 = uVar12;
          pIVar24 = (ImGuiContext *)((long)pIVar21 + uVar26 * 0x2c + -0x2c);
          if (uVar26 == uVar25) break;
          pIVar24 = (ImGuiContext *)((long)&(pIVar20->IO).LogFilename + 4);
          pIVar9 = &pIVar20->IO;
          pIVar20 = pIVar24;
          uVar12 = uVar25 + 1;
        } while (*(ImU32 *)((long)&pIVar9->LogFilename + 4) != id);
        bVar28 = uVar25 < uVar26;
        pIVar21 = pIVar24;
      }
    }
    if (!bVar28) goto LAB_002241e6;
  }
  pIVar20 = pIVar21;
  local_90 = pIVar6;
  local_68 = label;
  if (pIVar21 == (ImGuiContext *)0x0) {
    _hovered = 0.0;
    fStack_84 = 0.0;
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max = (ImVec2)((ulong)bb.Max & 0xffffffff00000000);
    _held = 0.0;
    iVar22 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    if (iVar22 == iVar4) {
      iVar22 = iVar22 + 1;
      if (iVar4 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar4 / 2 + iVar4;
      }
      if (iVar22 < iVar19) {
        iVar22 = iVar19;
      }
      if (iVar4 < iVar22) {
        pIVar16 = (ImGuiTabItem *)MemAlloc((long)iVar22 * 0x2c);
        pIVar7 = (tab_bar->Tabs).Data;
        if (pIVar7 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar16,pIVar7,(long)(tab_bar->Tabs).Size * 0x2c);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar16;
        (tab_bar->Tabs).Capacity = iVar22;
      }
    }
    pIVar7 = (tab_bar->Tabs).Data;
    iVar22 = (tab_bar->Tabs).Size;
    pIVar7[iVar22].ID = (ImGuiID)_hovered;
    pIVar7[iVar22].Flags = (ImGuiTabItemFlags)fStack_84;
    pIVar7[iVar22].LastFrameVisible = -1;
    pIVar7[iVar22].LastFrameSelected = -1;
    pIVar7[iVar22].Offset = bb.Min.x;
    pIVar7[iVar22].Width = bb.Min.y;
    pIVar7[iVar22].ContentWidth = bb.Max.x;
    pIVar7[iVar22].RequestedWidth = -1.0;
    pIVar16 = pIVar7 + iVar22;
    pIVar16->NameOffset = -1;
    pIVar16->BeginOrder = -1;
    pIVar16->IndexDuringLayout = -1;
    *(float *)&pIVar7[iVar22].WantClose = _held;
    iVar22 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar22 + 1;
    pIVar7 = (tab_bar->Tabs).Data;
    pIVar20 = (ImGuiContext *)(pIVar7 + iVar22);
    pIVar7[iVar22].ID = id;
    tab_bar->TabsAddedNew = true;
  }
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)pIVar20 - *(int *)&(tab_bar->Tabs).Data) >> 2) * -0x745d;
  local_38 = pbVar27;
  IVar31 = TabItemCalcSize(local_68,(bool)((byte)uVar29 & 1 | pbVar27 != (bool *)0x0));
  pcVar11 = local_68;
  local_58 = IVar31.x;
  fStack_54 = IVar31.y;
  (pIVar20->IO).IniSavingRate = -1.0;
  if (((pIVar10->NextItemData).Flags & 1) != 0) {
    local_58 = (pIVar10->NextItemData).Width;
    (pIVar20->IO).IniSavingRate = local_58;
  }
  if (pIVar21 == (ImGuiContext *)0x0) {
    fVar32 = 1.0;
    if (1.0 <= local_58) {
      fVar32 = local_58;
    }
    (pIVar20->IO).DisplaySize.y = fVar32;
  }
  (pIVar20->IO).DeltaTime = local_58;
  sVar2 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar2 + 1;
  *(short *)((long)&(pIVar20->IO).IniFilename + 4) = sVar2;
  iVar22 = pIVar10->FrameCount;
  local_5c = 0;
  if ((uVar29 & 1) != 0) {
    local_5c = (uint)((pIVar20->field_0x4 & 1) == 0);
  }
  local_78 = tab_bar->Flags;
  iVar23 = tab_bar->PrevFrameVisible + 1;
  local_74 = (pIVar20->IO).ConfigFlags + 1;
  (pIVar20->IO).ConfigFlags = iVar22;
  *(uint *)&pIVar20->field_0x4 = uVar29;
  iVar4 = (tab_bar->TabsNames).Buf.Size;
  iVar19 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar19 = 0;
  }
  *(int *)&(pIVar20->IO).IniFilename = iVar19;
  local_70 = pIVar20;
  sVar17 = strlen(local_68);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar11,pcVar11 + sVar17 + 1);
  if ((uVar29 >> 0x15 & 1) == 0) {
    if ((((local_74 < iVar22) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0))
       && ((iVar22 <= iVar23 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
    if (((uVar29 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar28 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar23 < iVar22) && ((tab_bar->Tabs).Size == 1)) {
    bVar28 = (tab_bar->Flags & 2) == 0;
  }
  else {
    bVar28 = false;
  }
  if ((local_74 < iVar22) && (pIVar21 == (ImGuiContext *)0x0 || iVar22 <= iVar23)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return (bool)((uVar29 >> 0x15 & 1) == 0 & bVar28);
  }
  if (tab_bar->SelectedTabId == id) {
    (local_70->IO).BackendFlags = pIVar10->FrameCount;
  }
  uVar5 = *(uint *)&local_70->field_0x4;
  fVar32 = (local_70->IO).DisplaySize.y;
  fVar30 = (local_70->IO).DisplaySize.x;
  if ((uVar5 & 0xc0) == 0) {
    fVar30 = (float)(int)(fVar30 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar30 + (tab_bar->BarRect).Min.x;
  local_40 = (local_90->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar31.y = bb.Min.y;
  IVar31.x = bb.Min.x;
  (local_90->DC).CursorPos = IVar31;
  fVar32 = fVar32 + bb.Min.x;
  bb.Max.y = fStack_54 + bb.Min.y;
  bb.Max.x = fVar32;
  if ((uVar5 & 0xc0) == 0) {
    uVar8 = (uint3)(uVar5 >> 8);
    local_7c = (undefined4)CONCAT71((uint7)uVar8,1);
    if (tab_bar->ScrollingRectMinX <= bb.Min.x) {
      local_7c = CONCAT31(uVar8,tab_bar->ScrollingRectMaxX <= fVar32 &&
                                fVar32 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    local_7c = 0;
  }
  local_58 = (float)uVar29;
  if ((char)local_7c != '\0') {
    uVar29 = -(uint)(tab_bar->ScrollingRectMinX <= bb.Min.x);
    fStack_84 = bb.Min.y + -1.0;
    _hovered = (float)(~uVar29 & (uint)tab_bar->ScrollingRectMinX | (uint)bb.Min.x & uVar29);
    _held = tab_bar->ScrollingRectMaxX;
    local_94 = fStack_54 + bb.Min.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  pIVar6 = local_90;
  IVar31 = (local_90->DC).CursorMaxPos;
  fStack_84 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(pIVar10->Style).FramePadding.y);
  (pIVar6->DC).CursorMaxPos = IVar31;
  bVar13 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar13) {
    if ((char)local_7c != '\0') {
      PopClipRect();
    }
    (local_90->DC).CursorPos = local_40;
    return bVar28;
  }
  uVar29 = (uint)local_58 & 0x200000;
  bVar13 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar29 >> 0x11) + (uint)pIVar10->DragDropActive * 0x200 + 0x1010);
  pcVar11 = local_68;
  pIVar21 = local_70;
  if ((bVar13) && (uVar29 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  local_60 = uVar29;
  if (pIVar10->ActiveId != id) {
    SetItemAllowOverlap();
  }
  fVar32 = local_58;
  if (((((held == true) && (iVar22 <= local_74)) && (bVar14 = IsMouseDragging(0,-1.0), bVar14)) &&
      ((pIVar10->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar30 = (pIVar10->IO).MouseDelta.x, fVar30 < 0.0 &&
       (pIVar1 = &(pIVar10->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar30 && (bb.Max.x < (pIVar10->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,(ImGuiTabItem *)pIVar21,(pIVar10->IO).MousePos);
  }
  draw_list = local_90->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar28 == false) {
      idx = (uint)((local_78 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_78 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  IVar15 = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,(ImGuiTabItemFlags)fVar32,IVar15);
  RenderNavHighlight(&bb,id,1);
  bVar14 = IsItemHovered(0x20);
  if (bVar14) {
    bVar14 = IsMouseClicked(1,false);
    if (bVar14) {
      uVar29 = (uint)fVar32 >> 0x15 & 1;
    }
    else {
      bVar14 = IsMouseReleased(1);
      uVar29 = local_60;
      if (!bVar14) goto LAB_0022482f;
    }
    if (uVar29 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0022482f:
  uVar29 = tab_bar->Flags;
  if (local_38 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
    pIVar21 = local_70;
  }
  fVar30 = (float)((uint)fVar32 & 0xfffffffe);
  if ((char)local_5c == '\0') {
    fVar30 = fVar32;
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar29 >> 1 & 4 | (uint)fVar30,tab_bar->FramePadding,pcVar11,id,
             close_button_id,bVar28,&just_closed,&text_clipped);
  if ((local_38 != (bool *)0x0) && (just_closed != false)) {
    *local_38 = false;
    TabBarCloseTab(tab_bar,(ImGuiTabItem *)pIVar21);
  }
  fVar32 = local_58;
  if ((char)local_7c != '\0') {
    PopClipRect();
  }
  (local_90->DC).CursorPos = local_40;
  if ((((text_clipped == true) && (pIVar10->HoveredId == id)) && (held == false)) &&
     ((((tab_bar->Flags & 0x20) == 0 && ((pIVar21->field_0x4 & 0x10) == 0)) &&
      (bVar14 = IsItemHovered(0x800), bVar14)))) {
    pcVar18 = FindRenderedTextEnd(pcVar11,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar18 - (int)pcVar11),pcVar11);
  }
  if (((uint)fVar32 >> 0x15 & 1) == 0) {
    bVar13 = bVar28;
  }
  return bVar13;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    ImGuiContext& g = *GImGui;
    if (tab_bar->WantLayout)
    {
        ImGuiNextItemData backup_next_item_data = g.NextItemData;
        TabBarLayout(tab_bar);
        g.NextItemData = backup_next_item_data;
    }
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab_bar->TabsAddedNew = tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, (p_open != NULL) || (flags & ImGuiTabItemFlags_UnsavedDocument));
    tab->RequestedWidth = -1.0f;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        size.x = tab->RequestedWidth = g.NextItemData.Width;
    if (tab_is_new)
        tab->Width = ImMax(1.0f, size.x);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool tab_just_unsaved = (flags & ImGuiTabItemFlags_UnsavedDocument) && !(tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (!is_tab_button)
    {
        if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
            if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
        if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // _SetSelected can only be passed on explicit tab bar
            tab_bar->NextSelectedTabId = id;
    }

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, tab_just_unsaved ? (flags & ~ImGuiTabItemFlags_UnsavedDocument) : flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            if (IsItemHovered(ImGuiHoveredFlags_DelayNormal))
                SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}